

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O2

vector<duckdb::Value,_true> *
duckdb::TestVectorFlat::GenerateValues
          (vector<duckdb::Value,_true> *__return_storage_ptr__,TestVectorInfo *info,
          LogicalType *type)

{
  pointer pvVar1;
  child_list_t<LogicalType> *pcVar2;
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  *this;
  reference pvVar3;
  LogicalType *pLVar4;
  const_iterator cVar5;
  NotImplementedException *this_00;
  ulong __n;
  long lVar6;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar7;
  pointer __x;
  pointer pvVar8;
  initializer_list<duckdb::Value> __l;
  initializer_list<duckdb::Value> __l_00;
  initializer_list<duckdb::Value> __l_01;
  initializer_list<duckdb::Value> __l_02;
  allocator_type local_1e9;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *local_1e8;
  vector<duckdb::Value,_true> child_values;
  vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
  struct_children;
  undefined1 local_188 [128];
  TestVectorInfo *local_108;
  pointer local_100;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_f8;
  vector<duckdb::Value,_true> local_e0;
  vector<duckdb::Value,_true> local_c8;
  vector<duckdb::Value,_true> local_b0;
  LogicalType local_98;
  vector<duckdb::Value,_true> local_80;
  vector<duckdb::Value,_true> local_68;
  string local_50;
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1e8 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__;
  if (type->physical_type_ == LIST) {
    if (type->id_ == MAP) {
      pLVar4 = ListType::GetChildType(type);
      GenerateValues(&child_values,info,pLVar4);
      pvVar3 = vector<duckdb::Value,_true>::get<true>(&child_values,0);
      Value::Value((Value *)&struct_children,pvVar3);
      __l._M_len = 1;
      __l._M_array = (iterator)&struct_children;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_80,__l,&local_1e9);
      Value::MAP((Value *)local_188,pLVar4,&local_80);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1e8,(Value *)local_188);
      Value::~Value((Value *)local_188);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_80);
      Value::~Value((Value *)&struct_children);
      LogicalType::LogicalType(&local_98,type);
      Value::Value((Value *)local_188,&local_98);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1e8,(Value *)local_188);
      Value::~Value((Value *)local_188);
      LogicalType::~LogicalType(&local_98);
      pvVar3 = vector<duckdb::Value,_true>::get<true>(&child_values,1);
      Value::Value((Value *)&struct_children,pvVar3);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&struct_children;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b0,__l_00,
                 &local_1e9);
      Value::MAP((Value *)local_188,pLVar4,&local_b0);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1e8,(Value *)local_188);
      Value::~Value((Value *)local_188);
      pvVar7 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b0;
    }
    else {
      pLVar4 = ListType::GetChildType(type);
      GenerateValues(&child_values,info,pLVar4);
      pvVar3 = vector<duckdb::Value,_true>::get<true>(&child_values,0);
      Value::Value((Value *)local_188,pvVar3);
      pvVar3 = vector<duckdb::Value,_true>::get<true>(&child_values,1);
      Value::Value((Value *)(local_188 + 0x40),pvVar3);
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)local_188;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8,__l_01,
                 &local_1e9);
      Value::LIST((Value *)&struct_children,pLVar4,&local_c8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1e8,(Value *)&struct_children);
      Value::~Value((Value *)&struct_children);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8);
      lVar6 = 0x40;
      do {
        Value::~Value((Value *)(local_188 + lVar6));
        lVar6 = lVar6 + -0x40;
      } while (lVar6 != -0x40);
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::LIST((Value *)local_188,pLVar4,&local_68);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1e8,(Value *)local_188);
      Value::~Value((Value *)local_188);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
      pvVar3 = vector<duckdb::Value,_true>::get<true>(&child_values,2);
      Value::Value((Value *)&struct_children,pvVar3);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&struct_children;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e0,__l_02,
                 &local_1e9);
      Value::LIST((Value *)local_188,pLVar4,&local_e0);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1e8,(Value *)local_188);
      Value::~Value((Value *)local_188);
      pvVar7 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e0;
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(pvVar7);
    Value::~Value((Value *)&struct_children);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&child_values);
  }
  else if (type->physical_type_ == STRUCT) {
    struct_children.
    super_vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    struct_children.
    super_vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    struct_children.
    super_vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108 = info;
    pcVar2 = StructType::GetChildTypes_abi_cxx11_(type);
    ::std::
    vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ::resize(&struct_children.
              super_vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
             ,3);
    local_100 = (pcVar2->
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (__x = (pcVar2->
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        pvVar1 = struct_children.
                 super_vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                 .
                 super__Vector_base<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, __x != local_100; __x = __x + 1) {
      GenerateValues(&child_values,local_108,&__x->second);
      for (__n = 0; __n < (ulong)((long)child_values.
                                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)child_values.
                                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 6);
          __n = __n + 1) {
        this = (vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                *)vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
                  ::get<true>(&struct_children,__n);
        pvVar3 = vector<duckdb::Value,_true>::get<true>(&child_values,__n);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
        ::pair<duckdb::Value,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                    *)local_188,&__x->first,pvVar3);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                  (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                         *)local_188);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                 *)local_188);
      }
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&child_values);
    }
    for (pvVar8 = struct_children.
                  super_vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                  .
                  super__Vector_base<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar1; pvVar8 = pvVar8 + 1)
    {
      local_f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pvVar8->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pvVar8->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pvVar8->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pvVar8->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar8->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar8->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::STRUCT((Value *)local_188,(child_list_t<Value> *)&local_f8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1e8,(Value *)local_188);
      Value::~Value((Value *)local_188);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_f8);
    }
    ::std::
    vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ::~vector(&struct_children.
               super_vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
             );
  }
  else {
    local_188[0] = (string)type->id_;
    cVar5 = ::std::
            _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
            ::find(&info->test_type_map->_M_t,local_188);
    pvVar7 = local_1e8;
    if ((_Rb_tree_header *)cVar5._M_node ==
        &(info->test_type_map->_M_t)._M_impl.super__Rb_tree_header) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_188,"Unimplemented type for test_vector_types %s",
                 (allocator *)&struct_children);
      LogicalType::ToString_abi_cxx11_(&local_50,type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_00,(string *)local_188,&local_50);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
              (local_1e8,(value_type *)(cVar5._M_node + 3));
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
              (pvVar7,(value_type *)(cVar5._M_node + 5));
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<duckdb::LogicalType_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)pvVar7,type);
    local_1e8 = pvVar7;
  }
  return (vector<duckdb::Value,_true> *)local_1e8;
}

Assistant:

static vector<Value> GenerateValues(TestVectorInfo &info, const LogicalType &type) {
		vector<Value> result;
		switch (type.InternalType()) {
		case PhysicalType::STRUCT: {
			vector<child_list_t<Value>> struct_children;
			auto &child_types = StructType::GetChildTypes(type);

			struct_children.resize(TEST_VECTOR_CARDINALITY);
			for (auto &child_type : child_types) {
				auto child_values = GenerateValues(info, child_type.second);

				for (idx_t i = 0; i < child_values.size(); i++) {
					struct_children[i].push_back(make_pair(child_type.first, std::move(child_values[i])));
				}
			}
			for (auto &struct_child : struct_children) {
				result.push_back(Value::STRUCT(std::move(struct_child)));
			}
			break;
		}
		case PhysicalType::LIST: {
			if (type.id() == LogicalTypeId::MAP) {
				auto &child_type = ListType::GetChildType(type);
				auto child_values = GenerateValues(info, child_type);
				result.push_back(Value::MAP(child_type, {child_values[0]}));
				result.push_back(Value(type));
				result.push_back(Value::MAP(child_type, {child_values[1]}));
				break;
			}
			auto &child_type = ListType::GetChildType(type);
			auto child_values = GenerateValues(info, child_type);

			result.push_back(Value::LIST(child_type, {child_values[0], child_values[1]}));
			result.push_back(Value::LIST(child_type, {}));
			result.push_back(Value::LIST(child_type, {child_values[2]}));
			break;
		}
		default: {
			auto entry = info.test_type_map.find(type.id());
			if (entry == info.test_type_map.end()) {
				throw NotImplementedException("Unimplemented type for test_vector_types %s", type.ToString());
			}
			result.push_back(entry->second.min_value);
			result.push_back(entry->second.max_value);
			result.emplace_back(type);
			break;
		}
		}
		return result;
	}